

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::UnorderedArrayList
          (UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *this,SlabAllocator *alloc)

{
  SnapObject *pSVar1;
  SnapObject *newBlockData;
  SlabAllocator *alloc_local;
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *this_local;
  
  this->m_alloc = alloc;
  pSVar1 = SlabAllocatorBase<0>::SlabAllocateFixedSizeArray<TTD::NSSnapObjects::SnapObject,4096ul>
                     (this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pSVar1;
  (this->m_inlineHeadBlock).CurrPos = pSVar1;
  (this->m_inlineHeadBlock).EndPos = pSVar1 + 0x1000;
  (this->m_inlineHeadBlock).Next = (UnorderedArrayListLink *)0x0;
  return;
}

Assistant:

UnorderedArrayList(SlabAllocator* alloc)
            : m_alloc(alloc)
        {
            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = nullptr;
        }